

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O0

void substSelect(sqlite3 *db,Select *p,int iTable,ExprList *pEList)

{
  SrcList *pSVar1;
  Expr *pEVar2;
  int local_3c;
  SrcList_item *pSStack_38;
  int i;
  SrcList_item *pItem;
  SrcList *pSrc;
  ExprList *pEList_local;
  int iTable_local;
  Select *p_local;
  sqlite3 *db_local;
  
  if (p != (Select *)0x0) {
    substExprList(db,p->pEList,iTable,pEList);
    substExprList(db,p->pGroupBy,iTable,pEList);
    substExprList(db,p->pOrderBy,iTable,pEList);
    pEVar2 = substExpr(db,p->pHaving,iTable,pEList);
    p->pHaving = pEVar2;
    pEVar2 = substExpr(db,p->pWhere,iTable,pEList);
    p->pWhere = pEVar2;
    substSelect(db,p->pPrior,iTable,pEList);
    pSVar1 = p->pSrc;
    if (pSVar1 != (SrcList *)0x0) {
      pSStack_38 = pSVar1->a;
      for (local_3c = (int)pSVar1->nSrc; 0 < local_3c; local_3c = local_3c + -1) {
        substSelect(db,pSStack_38->pSelect,iTable,pEList);
        pSStack_38 = pSStack_38 + 1;
      }
    }
  }
  return;
}

Assistant:

static void substSelect(
  sqlite3 *db,         /* Report malloc errors here */
  Select *p,           /* SELECT statement in which to make substitutions */
  int iTable,          /* Table to be replaced */
  ExprList *pEList     /* Substitute values */
){
  SrcList *pSrc;
  struct SrcList_item *pItem;
  int i;
  if( !p ) return;
  substExprList(db, p->pEList, iTable, pEList);
  substExprList(db, p->pGroupBy, iTable, pEList);
  substExprList(db, p->pOrderBy, iTable, pEList);
  p->pHaving = substExpr(db, p->pHaving, iTable, pEList);
  p->pWhere = substExpr(db, p->pWhere, iTable, pEList);
  substSelect(db, p->pPrior, iTable, pEList);
  pSrc = p->pSrc;
  assert( pSrc );  /* Even for (SELECT 1) we have: pSrc!=0 but pSrc->nSrc==0 */
  if( ALWAYS(pSrc) ){
    for(i=pSrc->nSrc, pItem=pSrc->a; i>0; i--, pItem++){
      substSelect(db, pItem->pSelect, iTable, pEList);
    }
  }
}